

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O0

void sigmund_tweak(int npts,t_float *ftreal,t_float *ftimag,int npeak,t_peak_conflict *peaks,
                  t_float fperbin,int loud)

{
  long lVar1;
  t_float pidetune_00;
  float fVar2;
  t_float tVar3;
  double dVar4;
  undefined8 uStack_100;
  double local_f8;
  undefined1 auStack_f0 [4];
  t_float local_ec;
  float local_e8;
  float local_e4;
  t_float phaseim;
  t_float phasere;
  t_float sx;
  t_float freqdiff;
  t_float neighborimag;
  t_float neighborreal;
  t_peak_conflict *neighbor;
  t_float freqout;
  t_float ampoutimag;
  t_float ampoutreal;
  t_float ampout;
  t_float ampcorrect;
  t_float cospidetune;
  t_float sinpidetune;
  t_float pidetune;
  t_float detune;
  t_float windpower;
  t_float windimag;
  t_float windreal;
  int nsub;
  int cbin;
  t_float oneovern;
  t_float phaseperbin;
  t_float binperf;
  t_float ampimag [3];
  t_float ampreal [3];
  int k;
  int j;
  int peaki;
  t_peak_conflict negpeak;
  t_peak_conflict **peakptrs;
  int loud_local;
  t_float fperbin_local;
  t_peak_conflict *peaks_local;
  int npeak_local;
  t_float *ftimag_local;
  t_float *ftreal_local;
  int npts_local;
  
  lVar1 = -((long)npeak * 8 + 0x17U & 0xfffffffffffffff0);
  if (0 < npeak) {
    for (k = 0; k < npeak; k = k + 1) {
      *(t_peak_conflict **)(auStack_f0 + lVar1 + -8 + (long)(k + 1) * 8) = peaks + k;
    }
    nsub = (int)(1.0 / (float)npts);
    cbin = (int)(((float)npts - 0.5) / (float)npts);
    oneovern = 1.0 / fperbin;
    negpeak._24_8_ = auStack_f0 + lVar1 + -8;
    *(undefined8 *)((long)&uStack_100 + lVar1) = 0x206cb6;
    qsort(auStack_f0 + lVar1,(long)npeak,8,sigmund_cmp_freq);
    *(int **)negpeak._24_8_ = &j;
    negpeak.p_freq = *(t_float *)(*(long *)(negpeak._24_8_ + 8) + 8);
    negpeak.p_amp = -*(t_float *)(*(long *)(negpeak._24_8_ + 8) + 0xc);
    j = **(uint **)(negpeak._24_8_ + 8) ^ 0x80000000;
    for (k = 1; k <= npeak; k = k + 1) {
      windreal = (t_float)(int)(**(float **)(negpeak._24_8_ + (long)k * 8) * oneovern + 0.5);
      windimag = 2.8026e-45;
      if (k == npeak) {
        windimag = 1.4013e-45;
      }
      if ((-1 < (int)windreal) && ((int)windreal <= npts * 2 + -3)) {
        for (ampreal[2] = 0.0; (int)ampreal[2] < 3; ampreal[2] = (t_float)((int)ampreal[2] + 1)) {
          ampimag[(long)(int)ampreal[2] + 1] = ftreal[(int)windreal + (int)ampreal[2] * 2 + -2];
          (&phaseperbin)[(int)ampreal[2]] = ftimag[(int)windreal + (int)ampreal[2] * 2 + -2];
        }
        for (ampreal[2] = 0.0; (int)ampreal[2] < (int)windimag;
            ampreal[2] = (t_float)((int)ampreal[2] + 1)) {
          _neighborimag = *(float **)(negpeak._24_8_ + (long)(k + -1 + (int)ampreal[2] * 2) * 8);
          freqdiff = (float)npts * _neighborimag[2];
          sx = (float)npts * _neighborimag[3];
          for (ampreal[1] = 0.0; (int)ampreal[1] < 3; ampreal[1] = (t_float)((int)ampreal[1] + 1)) {
            local_ec = (-oneovern * *_neighborimag +
                       (float)((int)windreal + (int)ampreal[1] * 2 + -2)) * 1.5707964;
            dVar4 = (double)local_ec;
            phasere = local_ec;
            *(undefined8 *)((long)&uStack_100 + lVar1) = 0x206edf;
            dVar4 = sin(dVar4);
            tVar3 = local_ec;
            *(undefined8 *)((long)&uStack_100 + lVar1) = 0x206ef3;
            phaseim = sinx(tVar3,(float)dVar4);
            fVar2 = phasere * (float)cbin;
            *(undefined8 *)((long)&uStack_100 + lVar1) = 0x206f14;
            dVar4 = cos((double)fVar2);
            local_e4 = (float)dVar4;
            fVar2 = phasere * (float)cbin;
            *(undefined8 *)((long)&uStack_100 + lVar1) = 0x206f39;
            dVar4 = sin((double)fVar2);
            local_e8 = (float)dVar4;
            ampimag[(long)(int)ampreal[1] + 1] =
                 -phaseim * (local_e4 * freqdiff + -(local_e8 * sx)) +
                 ampimag[(long)(int)ampreal[1] + 1];
            (&phaseperbin)[(int)ampreal[1]] =
                 -phaseim * (local_e8 * freqdiff + local_e4 * sx) + (&phaseperbin)[(int)ampreal[1]];
          }
        }
        windpower = ampimag[2] * 0.5 + -((ampimag[1] + ampreal[0]) * 0.25);
        detune = binperf * 0.5 + -((phaseperbin + ampimag[0]) * 0.25);
        pidetune = windpower * windpower + detune * detune;
        sinpidetune = ((ampimag[1] - ampreal[0]) * 0.5 *
                       (ampimag[2] + -((ampimag[1] + ampreal[0]) * 0.5)) +
                      (phaseperbin - ampimag[0]) * 0.5 *
                      (binperf + -((phaseperbin + ampimag[0]) * 0.5))) / (pidetune * 4.0);
        if (sinpidetune <= 0.5) {
          if (sinpidetune < -0.5) {
            sinpidetune = -0.5;
          }
        }
        else {
          sinpidetune = 0.5;
        }
        cospidetune = sinpidetune * 3.1415927;
        dVar4 = (double)cospidetune;
        *(undefined8 *)((long)&uStack_100 + lVar1) = 0x207269;
        dVar4 = sin(dVar4);
        ampcorrect = (t_float)dVar4;
        dVar4 = (double)cospidetune;
        *(undefined8 *)((long)&uStack_100 + lVar1) = 0x207286;
        dVar4 = cos(dVar4);
        pidetune_00 = cospidetune;
        tVar3 = ampcorrect;
        ampout = (t_float)dVar4;
        *(undefined8 *)((long)&uStack_100 + lVar1) = 0x2072a7;
        tVar3 = window_hann_mag(pidetune_00,tVar3);
        ampoutreal = 1.0 / tVar3;
        local_f8 = (double)((float)nsub * ampoutreal);
        dVar4 = (double)pidetune;
        *(undefined8 *)((long)&uStack_100 + lVar1) = 0x2072f0;
        dVar4 = sqrt(dVar4);
        ampoutimag = (t_float)(local_f8 * dVar4);
        freqout = (float)nsub * ampoutreal * (windpower * ampout + -(detune * ampcorrect));
        neighbor._4_4_ = (float)nsub * ampoutreal * (windpower * ampcorrect + detune * ampout);
        neighbor._0_4_ = (sinpidetune + sinpidetune + (float)(int)windreal) * fperbin;
        **(float **)(negpeak._24_8_ + (long)k * 8) = neighbor._0_4_;
        *(t_float *)(*(long *)(negpeak._24_8_ + (long)k * 8) + 4) = ampoutimag;
        *(t_float *)(*(long *)(negpeak._24_8_ + (long)k * 8) + 8) = freqout;
        *(float *)(*(long *)(negpeak._24_8_ + (long)k * 8) + 0xc) = neighbor._4_4_;
      }
    }
  }
  return;
}

Assistant:

static void sigmund_tweak(int npts, t_float *ftreal, t_float *ftimag,
    int npeak, t_peak *peaks, t_float fperbin, int loud)
{
    t_peak **peakptrs = (t_peak **)alloca(sizeof (*peakptrs) * (npeak+1));
    t_peak negpeak;
    int peaki, j, k;
    t_float ampreal[3], ampimag[3];
    t_float binperf = 1./fperbin;
    t_float phaseperbin = (npts-0.5)/npts, oneovern = 1./npts;
    if (npeak < 1)
        return;
    for (peaki = 0; peaki < npeak; peaki++)
        peakptrs[peaki+1] = &peaks[peaki];
    qsort(peakptrs+1, npeak, sizeof (*peakptrs), sigmund_cmp_freq);
    peakptrs[0] = &negpeak;
    negpeak.p_ampreal = peakptrs[1]->p_ampreal;
    negpeak.p_ampimag = -peakptrs[1]->p_ampimag;
    negpeak.p_freq = -peakptrs[1]->p_freq;
    for (peaki = 1; peaki <= npeak; peaki++)
    {
        int cbin = peakptrs[peaki]->p_freq*binperf + 0.5;
        int nsub = (peaki == npeak ? 1:2);
        t_float windreal, windimag, windpower, detune, pidetune, sinpidetune,
            cospidetune, ampcorrect, ampout, ampoutreal, ampoutimag, freqout;
        /* post("3 nsub %d amp %f freq %f", nsub,
            peakptrs[peaki]->p_amp, peakptrs[peaki]->p_freq); */
        if (cbin < 0 || cbin > 2*npts - 3)
            continue;
        for (j = 0; j < 3; j++)
            ampreal[j] = ftreal[cbin+2*j-2], ampimag[j] = ftimag[cbin+2*j-2];
        /* post("a %f %f", ampreal[1], ampimag[1]); */
        for (j = 0; j < nsub; j++)
        {
            t_peak *neighbor = peakptrs[(peaki-1) + 2*j];
            t_float neighborreal = npts * neighbor->p_ampreal;
            t_float neighborimag = npts * neighbor->p_ampimag;
            for (k = 0; k < 3; k++)
            {
                t_float freqdiff = (0.5*PI) * ((cbin + 2*k-2)
                    -binperf * neighbor->p_freq);
                t_float sx = sinx(freqdiff, sin(freqdiff));
                t_float phasere = cos(freqdiff * phaseperbin);
                t_float phaseim = sin(freqdiff * phaseperbin);
                ampreal[k] -=
                    sx * (phasere * neighborreal - phaseim * neighborimag);
                ampimag[k] -=
                    sx * (phaseim * neighborreal + phasere * neighborimag);
            }       
            /* post("b %f %f", ampreal[1], ampimag[1]); */
        }

        windreal = W_ALPHA * ampreal[1] -
            (0.5 * W_BETA) * (ampreal[0] + ampreal[2]);
        windimag = W_ALPHA * ampimag[1] -
            (0.5 * W_BETA) * (ampimag[0] + ampimag[2]);
        windpower = windreal * windreal + windimag * windimag;
        detune = (
            W_BETA*(ampreal[0] - ampreal[2]) * 
                (2.0*W_ALPHA * ampreal[1] - W_BETA * (ampreal[0] + ampreal[2]))
                    +
            W_BETA*(ampimag[0] - ampimag[2]) *
                (2.0*W_ALPHA * ampimag[1] - W_BETA * (ampimag[0] + ampimag[2]))
                        ) / (4.0 * windpower);
        if (detune > 0.5)
            detune = 0.5;
        else if (detune < -0.5)
            detune = -0.5;
        /* if (loud > 0)
            post("tweak: windpower %f, bin %d, detune %f",
                windpower, cbin, detune); */
        pidetune = PI * detune;
        sinpidetune = sin(pidetune);
        cospidetune = cos(pidetune);

        ampcorrect = 1.0 / window_hann_mag(pidetune, sinpidetune);

        ampout = oneovern * ampcorrect *sqrt(windpower);
        ampoutreal = oneovern * ampcorrect *
            (windreal * cospidetune - windimag * sinpidetune);
        ampoutimag = oneovern * ampcorrect *
            (windreal * sinpidetune + windimag * cospidetune);
        freqout = (cbin + 2*detune) * fperbin;
        /* if (loud > 1)
            post("amp %f, freq %f", ampout, freqout); */
        
        peakptrs[peaki]->p_freq = freqout;
        peakptrs[peaki]->p_amp = ampout;
        peakptrs[peaki]->p_ampreal = ampoutreal;
        peakptrs[peaki]->p_ampimag = ampoutimag;
    }
}